

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O1

void mergesort_3way(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  ostream *poVar4;
  uchar **ppuVar5;
  uchar **ppuVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  ulong n_00;
  ulong uVar10;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"mergesort_3way",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(), n=",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (0x1f < n) {
    n_00 = n / 3;
    uVar10 = (n * 2) / 3;
    mergesort_3way(strings,n_00,tmp);
    mergesort_3way(strings + n_00,uVar10 - n_00,tmp);
    mergesort_3way(strings + uVar10,n - uVar10,tmp);
    merge_3way(strings,n_00,strings + n_00,uVar10 - n_00,strings + uVar10,n - uVar10,tmp);
    memcpy(strings,tmp,n << 3);
    return;
  }
  ppuVar5 = strings;
  if (1 < (long)n) {
    do {
      iVar3 = (int)n;
      n = (size_t)(iVar3 - 1);
      pbVar1 = ppuVar5[1];
      for (ppuVar6 = ppuVar5 + 1; strings < ppuVar6; ppuVar6 = ppuVar6 + -1) {
        pbVar2 = ppuVar6[-1];
        bVar7 = *pbVar2;
        bVar8 = *pbVar1;
        if (bVar7 != 0 && bVar7 == bVar8) {
          lVar9 = 1;
          do {
            bVar7 = pbVar2[lVar9];
            bVar8 = pbVar1[lVar9];
            if (bVar7 == 0) break;
            lVar9 = lVar9 + 1;
          } while (bVar7 == bVar8);
        }
        if (bVar7 <= bVar8) break;
        *ppuVar6 = pbVar2;
      }
      *ppuVar6 = pbVar1;
      ppuVar5 = ppuVar5 + 1;
    } while (2 < iVar3);
  }
  return;
}

Assistant:

static void
mergesort_3way(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/3, split1 = (2*n)/3;
	mergesort_3way(strings,        split0,        tmp);
	mergesort_3way(strings+split0, split1-split0, tmp);
	mergesort_3way(strings+split1, n-split1,      tmp);
	merge_3way(strings, split0,
	           strings+split0, split1-split0,
	           strings+split1, n-split1,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}